

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O1

fy_atom_iter * fy_atom_iter_create(fy_atom *atom)

{
  fy_atom_iter *pfVar1;
  
  pfVar1 = (fy_atom_iter *)malloc(0x1e8);
  if (pfVar1 == (fy_atom_iter *)0x0) {
    pfVar1 = (fy_atom_iter *)0x0;
  }
  else {
    if (atom == (fy_atom *)0x0) {
      pfVar1 = (fy_atom_iter *)memset(pfVar1,0,0x1e8);
      return pfVar1;
    }
    fy_atom_iter_start(atom,pfVar1);
  }
  return pfVar1;
}

Assistant:

struct fy_atom_iter *
fy_atom_iter_create(const struct fy_atom *atom) {
    struct fy_atom_iter *iter;

    iter = malloc(sizeof(*iter));
    if (!iter)
        return NULL;
    if (atom)
        fy_atom_iter_start(atom, iter);
    else
        memset(iter, 0, sizeof(*iter));
    return iter;
}